

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

int __thiscall HighsHashTree<int,_HighsImplications::VarBound>::NodePtr::numEntries(NodePtr *this)

{
  ulong uVar1;
  uint uVar2;
  logic_error *this_00;
  
  uVar1 = this->ptrAndType;
  uVar2 = (uint)uVar1 & 7;
  switch(uVar2) {
  case 0:
    break;
  case 1:
    uVar2 = *(uint *)((uVar1 & 0xfffffffffffffff8) + 0x20);
    break;
  default:
    uVar2 = *(uint *)((uVar1 & 0xfffffffffffffff8) + 8);
    break;
  case 6:
    uVar2 = 0x40;
    break;
  case 7:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unexpected type in hash tree");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return uVar2;
}

Assistant:

int numEntriesEstimate() const {
      switch (getType()) {
        case kEmpty:
          return 0;
        case kListLeaf:
          return 1;
        case kInnerLeafSizeClass1:
          return InnerLeaf<1>::capacity();
        case kInnerLeafSizeClass2:
          return InnerLeaf<2>::capacity();
        case kInnerLeafSizeClass3:
          return InnerLeaf<3>::capacity();
        case kInnerLeafSizeClass4:
          return InnerLeaf<4>::capacity();
        case kBranchNode:
          // something large should be returned so that the number of entries
          // is estimated above the threshold to merge when the parent checks
          // its children after deletion
          return kBranchFactor;
        default:
          throw std::logic_error("Unexpected type in hash tree");
      }
    }